

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_parameter.hpp
# Opt level: O2

void __thiscall
ruckig::OutputParameter<3UL,_ruckig::StandardVector>::pass_to_input
          (OutputParameter<3UL,_ruckig::StandardVector> *this,
          InputParameter<3UL,_ruckig::StandardVector> *input)

{
  const_iterator __position;
  double dVar1;
  
  (input->current_position)._M_elems[2] = (this->new_position)._M_elems[2];
  dVar1 = (this->new_position)._M_elems[1];
  (input->current_position)._M_elems[0] = (this->new_position)._M_elems[0];
  (input->current_position)._M_elems[1] = dVar1;
  (input->current_velocity)._M_elems[2] = (this->new_velocity)._M_elems[2];
  dVar1 = (this->new_velocity)._M_elems[1];
  (input->current_velocity)._M_elems[0] = (this->new_velocity)._M_elems[0];
  (input->current_velocity)._M_elems[1] = dVar1;
  (input->current_acceleration)._M_elems[2] = (this->new_acceleration)._M_elems[2];
  dVar1 = (this->new_acceleration)._M_elems[1];
  (input->current_acceleration)._M_elems[0] = (this->new_acceleration)._M_elems[0];
  (input->current_acceleration)._M_elems[1] = dVar1;
  if ((this->did_section_change == true) &&
     (__position._M_current =
           (input->intermediate_positions).
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start,
     __position._M_current !=
     (input->intermediate_positions).
     super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::erase
              (&input->intermediate_positions,__position);
    return;
  }
  return;
}

Assistant:

void pass_to_input(InputParameter<DOFs, CustomVector>& input) const {
        input.current_position = new_position;
        input.current_velocity = new_velocity;
        input.current_acceleration = new_acceleration;

        // Remove first intermediate waypoint if section did change
        if (did_section_change && !input.intermediate_positions.empty()) {
            input.intermediate_positions.erase(input.intermediate_positions.begin());
        }
    }